

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O1

unsigned_long QUtil::get_next_utf8_codepoint(string *utf8_val,size_t *pos,bool *error)

{
  byte bVar1;
  ulong uVar2;
  pointer pcVar3;
  bool bVar4;
  byte bVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  
  uVar9 = *pos;
  uVar2 = utf8_val->_M_string_length;
  *pos = uVar9 + 1;
  uVar7 = utf8_val->_M_string_length;
  uVar10 = uVar9;
  if (uVar7 <= uVar9) {
LAB_0024614d:
    std::__throw_out_of_range_fmt
              ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",uVar10,uVar7);
  }
  pcVar3 = (utf8_val->_M_dataplus)._M_p;
  bVar1 = pcVar3[uVar9];
  uVar6 = (ulong)bVar1;
  *error = false;
  if ((char)bVar1 < '\0') {
    if ((bVar1 & 0x40) == 0) {
      uVar8 = 0xffffff7f;
      lVar11 = 0;
    }
    else {
      uVar8 = 0x40;
      bVar5 = 0x80;
      lVar11 = 0;
      do {
        lVar11 = lVar11 + 1;
        bVar5 = bVar5 | (byte)uVar8;
        uVar8 = uVar8 >> 1;
      } while ((uVar8 & bVar1) != 0);
      uVar8 = ~(uint)bVar5;
    }
    if ((lVar11 - 6U < 0xfffffffffffffffb) || (uVar2 < uVar9 + 1 + lVar11)) {
LAB_002460f9:
      *error = true;
      uVar6 = 0xfffd;
    }
    else {
      uVar6 = (ulong)(uVar8 & bVar1);
      for (; lVar11 != 0; lVar11 = lVar11 + -1) {
        uVar10 = *pos;
        *pos = uVar10 + 1;
        uVar7 = utf8_val->_M_string_length;
        if (uVar7 <= uVar10) goto LAB_0024614d;
        bVar1 = pcVar3[uVar10];
        if ((bVar1 & 0xc0) != 0x80) {
          *pos = uVar10;
          goto LAB_002460f9;
        }
        uVar6 = uVar6 << 6 | (ulong)(bVar1 & 0x3f);
      }
      bVar4 = true;
      switch(*pos - uVar9) {
      case 2:
        uVar9 = 0x80;
        break;
      case 3:
        uVar9 = 0x800;
        break;
      case 4:
        uVar9 = 0x10000;
        break;
      case 5:
        uVar9 = 0x1000;
        break;
      case 6:
        uVar9 = 0x4000000;
        break;
      default:
        bVar4 = false;
        uVar9 = 0;
      }
      if ((bVar4) && (uVar6 < uVar9)) {
        *error = true;
      }
    }
  }
  return uVar6;
}

Assistant:

unsigned long
QUtil::get_next_utf8_codepoint(std::string const& utf8_val, size_t& pos, bool& error)
{
    auto o_pos = pos;
    size_t len = utf8_val.length();
    unsigned char ch = static_cast<unsigned char>(utf8_val.at(pos++));
    error = false;
    if (ch < 128) {
        return static_cast<unsigned long>(ch);
    }

    size_t bytes_needed = 0;
    unsigned bit_check = 0x40;
    unsigned char to_clear = 0x80;
    while (ch & bit_check) {
        ++bytes_needed;
        to_clear = static_cast<unsigned char>(to_clear | bit_check);
        bit_check >>= 1;
    }
    if (((bytes_needed > 5) || (bytes_needed < 1)) || ((pos + bytes_needed) > len)) {
        error = true;
        return 0xfffd;
    }

    auto codepoint = static_cast<unsigned long>(ch & ~to_clear);
    while (bytes_needed > 0) {
        --bytes_needed;
        ch = static_cast<unsigned char>(utf8_val.at(pos++));
        if ((ch & 0xc0) != 0x80) {
            --pos;
            error = true;
            return 0xfffd;
        }
        codepoint <<= 6;
        codepoint += (ch & 0x3f);
    }
    unsigned long lower_bound = 0;
    switch (pos - o_pos) {
    case 2:
        lower_bound = 1 << 7;
        break;
    case 3:
        lower_bound = 1 << 11;
        break;
    case 4:
        lower_bound = 1 << 16;
        break;
    case 5:
        lower_bound = 1 << 12;
        break;
    case 6:
        lower_bound = 1 << 26;
        break;
    default:
        lower_bound = 0;
    }

    if (lower_bound > 0 && codepoint < lower_bound) {
        // Too many bytes were used, but return whatever character was encoded.
        error = true;
    }
    return codepoint;
}